

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string * cs_impl::to_string<cs::pointer>(pointer *ptr)

{
  bool bVar1;
  string *in_RDI;
  pointer *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator *paVar2;
  string *this;
  string local_48 [16];
  any *in_stack_ffffffffffffffc8;
  allocator local_11 [17];
  
  this = in_RDI;
  bVar1 = cs::pointer::operator==((pointer *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    paVar2 = local_11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"null",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else {
    any::to_string_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::operator+((char *)this,in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string(local_48);
  }
  return in_RDI;
}

Assistant:

std::string to_string<cs::pointer>(const cs::pointer &ptr)
	{
		if (ptr == cs::null_pointer)
			return "null";
		else
			return "cs::pointer => " + ptr.data.to_string();
	}